

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_error.cpp
# Opt level: O0

void throw_error(int err,char *action)

{
  ostream *poVar1;
  char *pcVar2;
  runtime_error *this;
  string local_9e0 [32];
  char *local_9c0;
  char *err_msg;
  char tmp [2048];
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  char *local_18;
  char *action_local;
  int err_local;
  
  local_18 = action;
  action_local._4_4_ = err;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,local_18);
  poVar1 = std::operator<<(poVar1," failed, error: ");
  pcVar2 = anon_unknown.dwarf_1f0e4::error_enum_name(action_local._4_4_);
  std::operator<<(poVar1,pcVar2);
  local_9c0 = strerror_r(action_local._4_4_,(char *)&err_msg,0x800);
  poVar1 = std::operator<<(local_190," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,action_local._4_4_);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::operator<<(poVar1,local_9c0);
  std::operator<<(poVar1,")");
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(this,local_9e0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void throw_error [[noreturn]] (int err, char const* action)
{
    std::stringstream ss;
    ss << action << " failed, error: " << error_enum_name(err);
    char tmp[2048];
    char const* err_msg = strerror_r(err, tmp, sizeof tmp);
    ss << " (" << err << ", " << err_msg << ")";
    throw std::runtime_error(ss.str());
}